

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.cpp
# Opt level: O1

int __thiscall de::Socket::connect(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  deBool dVar1;
  runtime_error *this_00;
  undefined4 in_register_00000034;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  dVar1 = deSocket_connect(this->m_socket,*(deSocketAddress **)CONCAT44(in_register_00000034,__fd));
  if (dVar1 != 0) {
    return dVar1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Connecting socket failed","");
  std::runtime_error::runtime_error(this_00,(string *)local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_0010dd78;
  __cxa_throw(this_00,&SocketError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Socket::connect (const SocketAddress& address)
{
	if (!deSocket_connect(m_socket, address))
		throw SocketError("Connecting socket failed");
}